

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RPLIDAR.h
# Opt level: O1

int GetConfRPLIDAR(RPLIDAR *pRPLIDAR,int type,uchar *payload,int payloadsize,uchar *resppayload,
                  int resppayloadsize)

{
  RS232PORT *pRVar1;
  uchar *readbuf;
  int iVar2;
  int iVar3;
  ssize_t sVar4;
  byte bVar5;
  ulong uVar6;
  uint uVar7;
  char *__s;
  uint uVar8;
  int DataType;
  int DataResponseLength;
  int SendMode;
  uchar reqbuf [136];
  int local_d4;
  int local_d0 [2];
  RS232PORT *local_c8;
  uchar *local_c0;
  byte local_b8 [3];
  int local_b5;
  byte local_b1 [129];
  
  local_d0[0] = 0;
  local_d0[1] = 0;
  local_d4 = 0;
  if ((uint)payloadsize < 0x81) {
    local_c0 = resppayload;
    memset(local_b8,0,0x88);
    local_b8[0] = 0xa5;
    local_b8[1] = 0x84;
    local_b8[2] = (char)payloadsize + '\x04';
    local_b5 = type;
    if (payloadsize != 0) {
      memcpy(local_b1,payload,(ulong)(uint)payloadsize);
    }
    uVar6 = 0;
    bVar5 = 0;
    do {
      bVar5 = bVar5 ^ local_b8[uVar6];
      uVar6 = uVar6 + 1;
    } while (payloadsize + 7 != uVar6);
    uVar8 = payloadsize + 8;
    local_b8[(ulong)(uint)payloadsize + 7] = bVar5;
    pRVar1 = &pRPLIDAR->RS232Port;
    iVar3 = (pRPLIDAR->RS232Port).DevType;
    __s = "Error writing data to a RPLIDAR. ";
    if (iVar3 - 1U < 4) {
      iVar3 = (pRPLIDAR->RS232Port).s;
      uVar6 = 0;
      local_c8 = pRVar1;
      do {
        sVar4 = send(iVar3,local_b8 + uVar6,(long)(int)(uVar8 - (int)uVar6),0);
        if ((int)sVar4 < 1) goto LAB_0012cca7;
        uVar7 = (int)uVar6 + (int)sVar4;
        uVar6 = (ulong)uVar7;
      } while ((int)uVar7 < (int)uVar8);
    }
    else {
      if (iVar3 != 0) goto LAB_0012cca7;
      iVar3 = *(int *)&pRVar1->hDev;
      uVar6 = 0;
      local_c8 = pRVar1;
      do {
        sVar4 = write(iVar3,local_b8 + uVar6,(ulong)(uVar8 - (int)uVar6));
        if ((int)sVar4 < 1) goto LAB_0012cca7;
        uVar7 = (int)uVar6 + (int)sVar4;
        uVar6 = (ulong)uVar7;
      } while (uVar7 < uVar8);
    }
    iVar2 = GetResponseDescriptorRPLIDAR(pRPLIDAR,local_d0,local_d0 + 1,&local_d4);
    readbuf = local_c0;
    iVar3 = local_d0[0];
    if (iVar2 != 0) {
      return 1;
    }
    if (local_d4 == 0x20) {
      if (resppayloadsize < local_d0[0]) {
        __s = "Error writing data to a RPLIDAR : Invalid resppayloadsize. ";
      }
      else {
        memset(local_c0,0,(long)local_d0[0]);
        iVar3 = ReadAllRS232Port(local_c8,readbuf,iVar3);
        if (iVar3 == 0) {
          return 0;
        }
        __s = "A RPLIDAR is not responding correctly. ";
      }
    }
    else {
      __s = "A RPLIDAR is not responding correctly : Bad response descriptor. ";
    }
  }
  else {
    __s = "Error writing data to a RPLIDAR : Invalid payloadsize. ";
  }
LAB_0012cca7:
  puts(__s);
  return 1;
}

Assistant:

inline int GetConfRPLIDAR(RPLIDAR* pRPLIDAR, int type, unsigned char* payload, int payloadsize, unsigned char* resppayload, int resppayloadsize)
{
	unsigned char reqbuf[136];
	int DataResponseLength = 0, SendMode = 0, DataType = 0;

	if ((payloadsize < 0)||(payloadsize > 128))
	{
		printf("Error writing data to a RPLIDAR : Invalid payloadsize. \n");
		return EXIT_FAILURE;
	}

	memset(reqbuf, 0, sizeof(reqbuf));
	reqbuf[0] = START_FLAG1_RPLIDAR;
	reqbuf[1] = GET_LIDAR_CONF_REQUEST_RPLIDAR;
	reqbuf[2] = (unsigned char)(4+payloadsize);
	memcpy(reqbuf+3, (unsigned char*)&type, 4);
	if (payloadsize > 0) memcpy(reqbuf+7, payload, payloadsize);
	reqbuf[7+payloadsize] = ComputeChecksumRPLIDAR(reqbuf, 8+payloadsize);

	// Send request.
	if (WriteAllRS232Port(&pRPLIDAR->RS232Port, reqbuf, 8+payloadsize) != EXIT_SUCCESS)
	{
		printf("Error writing data to a RPLIDAR. \n");
		return EXIT_FAILURE;
	}

	// Receive the response descriptor.
	if (GetResponseDescriptorRPLIDAR(pRPLIDAR, &DataResponseLength, &SendMode, &DataType) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	// Quick check of the response descriptor.
	if (DataType != GET_LIDAR_CONF_RESPONSE_RPLIDAR)
	{
		printf("A RPLIDAR is not responding correctly : Bad response descriptor. \n");
		return EXIT_FAILURE;
	}

	if (DataResponseLength > resppayloadsize)
	{
		printf("Error writing data to a RPLIDAR : Invalid resppayloadsize. \n");
		return EXIT_FAILURE;
	}

	// Receive the data response.
	memset(resppayload, 0, DataResponseLength);
	if (ReadAllRS232Port(&pRPLIDAR->RS232Port, resppayload, DataResponseLength) != EXIT_SUCCESS)
	{
		printf("A RPLIDAR is not responding correctly. \n");
		return EXIT_FAILURE;
	}
	return EXIT_SUCCESS;
}